

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O0

void Gia_ManFindCaninicalOrder_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vAnds)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *vAnds_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar2 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar2 != 0) {
    return;
  }
  Gia_ObjSetTravIdCurrent(p,pObj);
  iVar2 = Gia_ObjIsAnd(pObj);
  if (iVar2 == 0) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                  ,0x35c,"void Gia_ManFindCaninicalOrder_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)"
                 );
  }
  pGVar3 = Gia_ObjFanin0(pObj);
  iVar2 = Gia_ObjIsAnd(pGVar3);
  if (iVar2 != 0) {
    pGVar3 = Gia_ObjFanin1(pObj);
    iVar2 = Gia_ObjIsAnd(pGVar3);
    if (iVar2 != 0) {
      pGVar3 = Gia_ObjFanin0(pObj);
      uVar1 = pGVar3->Value;
      pGVar3 = Gia_ObjFanin1(pObj);
      if (uVar1 == pGVar3->Value) {
        __assert_fail("Gia_ObjFanin0(pObj)->Value != Gia_ObjFanin1(pObj)->Value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                      ,0x364,
                      "void Gia_ManFindCaninicalOrder_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
      }
      pGVar3 = Gia_ObjFanin0(pObj);
      uVar1 = pGVar3->Value;
      pGVar3 = Gia_ObjFanin1(pObj);
      if (uVar1 < pGVar3->Value) {
        pGVar3 = Gia_ObjFanin0(pObj);
        Gia_ManFindCaninicalOrder_rec(p,pGVar3,vAnds);
        pGVar3 = Gia_ObjFanin1(pObj);
        Gia_ManFindCaninicalOrder_rec(p,pGVar3,vAnds);
      }
      else {
        pGVar3 = Gia_ObjFanin1(pObj);
        Gia_ManFindCaninicalOrder_rec(p,pGVar3,vAnds);
        pGVar3 = Gia_ObjFanin0(pObj);
        Gia_ManFindCaninicalOrder_rec(p,pGVar3,vAnds);
      }
      goto LAB_00968e89;
    }
  }
  pGVar3 = Gia_ObjFanin0(pObj);
  Gia_ManFindCaninicalOrder_rec(p,pGVar3,vAnds);
  pGVar3 = Gia_ObjFanin1(pObj);
  Gia_ManFindCaninicalOrder_rec(p,pGVar3,vAnds);
LAB_00968e89:
  iVar2 = Gia_ObjId(p,pObj);
  Vec_IntPush(vAnds,iVar2);
  return;
}

Assistant:

void Gia_ManFindCaninicalOrder_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vAnds )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    assert( Gia_ObjIsAnd(pObj) );
    if ( !Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) || !Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) )
    {
        Gia_ManFindCaninicalOrder_rec( p, Gia_ObjFanin0(pObj), vAnds );
        Gia_ManFindCaninicalOrder_rec( p, Gia_ObjFanin1(pObj), vAnds );
    }
    else
    {
        assert( Gia_ObjFanin0(pObj)->Value != Gia_ObjFanin1(pObj)->Value );
        if ( Gia_ObjFanin0(pObj)->Value < Gia_ObjFanin1(pObj)->Value )
        {
            Gia_ManFindCaninicalOrder_rec( p, Gia_ObjFanin0(pObj), vAnds );
            Gia_ManFindCaninicalOrder_rec( p, Gia_ObjFanin1(pObj), vAnds );
        }
        else
        {
            Gia_ManFindCaninicalOrder_rec( p, Gia_ObjFanin1(pObj), vAnds );
            Gia_ManFindCaninicalOrder_rec( p, Gia_ObjFanin0(pObj), vAnds );
        }
    }
    Vec_IntPush( vAnds, Gia_ObjId(p, pObj) );
}